

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section_helper.hpp
# Opt level: O0

string * export_section<(pstore::repo::section_kind)2>
                   (string *__return_storage_ptr__,database *db,string_mapping *exported_strings,
                   section_content *content,bool comments)

{
  type content_00;
  string *psVar1;
  indent local_bc;
  undefined1 local_b8 [8];
  ostringstream os;
  not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> local_58;
  unique_ptr<const_pstore::repo::bss_section,_placement_delete<const_pstore::repo::bss_section>_>
  local_50;
  unique_ptr<const_pstore::repo::bss_section,_placement_delete<const_pstore::repo::bss_section>_>
  section;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  bool comments_local;
  section_content *content_local;
  string_mapping *exported_strings_local;
  database *db_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&section);
  pstore::gsl::not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>::not_null
            (&local_58,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&section);
  build_section<(pstore::repo::section_kind)2,pstore::repo::bss_section,pstore::repo::bss_section_creation_dispatcher>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,
             (section_content *)local_58.ptr_);
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_b8);
  local_bc.distance_ = 0;
  pstore::exchange::export_ns::indent::indent(&local_bc);
  content_00 = std::
               unique_ptr<const_pstore::repo::bss_section,_placement_delete<const_pstore::repo::bss_section>_>
               ::operator*(&local_50);
  pstore::exchange::export_ns::
  emit_section<(pstore::repo::section_kind)2,pstore::exchange::export_ns::ostringstream,pstore::repo::bss_section>
            ((ostringstream *)local_b8,local_bc,db,exported_strings,content_00,comments);
  psVar1 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_b8);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_b8);
  std::
  unique_ptr<const_pstore::repo::bss_section,_placement_delete<const_pstore::repo::bss_section>_>::
  ~unique_ptr(&local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&section);
  return __return_storage_ptr__;
}

Assistant:

std::string export_section (pstore::database const & db,
                            pstore::exchange::export_ns::string_mapping const & exported_strings,
                            pstore::repo::section_content const & content, bool comments) {
    // First build the section that we want to export.
    std::vector<std::uint8_t> buffer;
    auto const section = build_section<Kind> (&buffer, content);

    // Now export it.
    using namespace pstore::exchange::export_ns;
    ostringstream os;
    emit_section<Kind> (os, indent{}, db, exported_strings, *section, comments);
    return os.str ();
}